

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O2

ggml_tensor * __thiscall llm_graph_context::build_inp_cross_embd(llm_graph_context *this)

{
  llama_cross *plVar1;
  ggml_tensor *pgVar2;
  _Head_base<0UL,_llm_graph_input_i_*,_false> _Var3;
  _func_int **pp_Var4;
  ulong uVar5;
  ulong uVar6;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_20;
  _Head_base<0UL,_llm_graph_input_i_*,_false> local_18;
  
  std::make_unique<llm_graph_input_cross_embd,llama_cross_const*const&>((llama_cross **)&local_20);
  _Var3._M_head_impl = local_20._M_head_impl;
  plVar1 = this->cross;
  if ((plVar1->v_embd).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (plVar1->v_embd).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar5 = (ulong)this->hparams->n_ctx_train;
    uVar6 = (ulong)this->hparams->n_embd;
  }
  else {
    uVar6 = plVar1->n_embd;
    uVar5 = plVar1->n_enc;
  }
  pp_Var4 = (_func_int **)ggml_new_tensor_2d(this->ctx0,0,uVar6,uVar5);
  _Var3._M_head_impl[1]._vptr_llm_graph_input_i = pp_Var4;
  ggml_set_input(pp_Var4);
  local_18._M_head_impl = local_20._M_head_impl;
  local_20._M_head_impl = (llm_graph_input_i *)0x0;
  llm_graph_result::add_input
            ((this->res)._M_t.
             super___uniq_ptr_impl<llm_graph_result,_std::default_delete<llm_graph_result>_>._M_t.
             super__Tuple_impl<0UL,_llm_graph_result_*,_std::default_delete<llm_graph_result>_>.
             super__Head_base<0UL,_llm_graph_result_*,_false>._M_head_impl,
             (llm_graph_input_ptr *)&local_18);
  if (local_18._M_head_impl != (llm_graph_input_i *)0x0) {
    (*(local_18._M_head_impl)->_vptr_llm_graph_input_i[1])();
  }
  local_18._M_head_impl = (llm_graph_input_i *)0x0;
  pgVar2 = (ggml_tensor *)_Var3._M_head_impl[1]._vptr_llm_graph_input_i;
  if (local_20._M_head_impl != (llm_graph_input_i *)0x0) {
    (*(local_20._M_head_impl)->_vptr_llm_graph_input_i[1])();
  }
  return pgVar2;
}

Assistant:

ggml_tensor * llm_graph_context::build_inp_cross_embd() const {
    auto inp = std::make_unique<llm_graph_input_cross_embd>(cross);

    auto & cur = inp->cross_embd;

    // if we have the output embeddings from the encoder, use them directly
    // TODO: needs more work to be correct, for now just use the tensor shape
    //if (cross->t_embd) {
    //    cur = ggml_view_tensor(ctx0, cross->t_embd);

    //    return cur;
    //}

    const auto n_embd = !cross->v_embd.empty() ? cross->n_embd : hparams.n_embd;
    const auto n_enc  = !cross->v_embd.empty() ? cross->n_enc : hparams.n_ctx_train;

    cur = ggml_new_tensor_2d(ctx0, GGML_TYPE_F32, n_embd, n_enc);
    ggml_set_input(cur);

    res->add_input(std::move(inp));

    return cur;
}